

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfa_test.cc
# Opt level: O1

void re2::SingleThreadedSearchDFA(void)

{
  bool bVar1;
  Regexp *this;
  Prog *this_00;
  int extraout_EDX;
  int extraout_EDX_00;
  int extraout_EDX_01;
  char *this_01;
  int iVar2;
  bool failed;
  string match;
  StringPiece local_1e0;
  string no_match;
  undefined1 local_1b0 [16];
  pointer local_1a0 [46];
  
  StringPrintf_abi_cxx11_((string *)local_1b0,"0[01]{%d}$",0x12);
  no_match._M_dataplus._M_p = (pointer)local_1b0._0_8_;
  no_match._M_string_length._0_4_ = local_1b0._8_4_;
  this_01 = (char *)0x794;
  this = Regexp::Parse((StringPiece *)&no_match,LikePerl,(RegexpStatus *)0x0);
  iVar2 = extraout_EDX;
  if ((pointer *)local_1b0._0_8_ != local_1a0) {
    operator_delete((void *)local_1b0._0_8_);
    iVar2 = extraout_EDX_00;
  }
  if (this == (Regexp *)0x0) {
    LogMessage::LogMessage
              ((LogMessage *)local_1b0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/dfa_test.cc"
               ,0xbe,3);
    this_01 = "Check failed: re";
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_1b0 + 8),"Check failed: re",0x10);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_1b0);
    iVar2 = extraout_EDX_01;
  }
  DeBruijnString_abi_cxx11_(&no_match,(re2 *)this_01,iVar2);
  match._M_dataplus._M_p = (pointer)&match.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&match,no_match._M_dataplus._M_p,
             no_match._M_dataplus._M_p +
             CONCAT44(no_match._M_string_length._4_4_,no_match._M_string_length._0_4_));
  std::__cxx11::string::append((char *)&match);
  FLAGS_re2_dfa_bail_when_slow = 0;
  this_00 = Regexp::CompileToProg(this,0x40000);
  if (this_00 == (Prog *)0x0) {
    LogMessage::LogMessage
              ((LogMessage *)local_1b0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/dfa_test.cc"
               ,0xd2,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_1b0 + 8),"Check failed: prog",0x12);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_1b0);
  }
  iVar2 = 10;
  do {
    failed = false;
    local_1b0._0_8_ = match._M_dataplus._M_p;
    local_1b0._8_4_ = match._M_string_length._0_4_;
    local_1e0.ptr_ = (char *)0x0;
    local_1e0.length_ = 0;
    bVar1 = Prog::SearchDFA(this_00,(StringPiece *)local_1b0,&local_1e0,kUnanchored,kFirstMatch,
                            (StringPiece *)0x0,&failed,(vector<int,_std::allocator<int>_> *)0x0);
    if (failed != false) {
      LogMessage::LogMessage
                ((LogMessage *)local_1b0,
                 "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/dfa_test.cc"
                 ,0xd8,3);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_1b0 + 8),"Check failed: !failed",0x15);
      LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_1b0);
    }
    if (!bVar1) {
      LogMessage::LogMessage
                ((LogMessage *)local_1b0,
                 "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/dfa_test.cc"
                 ,0xd9,3);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_1b0 + 8),"Check failed: matched",0x15);
      LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_1b0);
    }
    local_1b0._0_8_ = no_match._M_dataplus._M_p;
    local_1b0._8_4_ = no_match._M_string_length._0_4_;
    local_1e0.ptr_ = (char *)0x0;
    local_1e0.length_ = 0;
    bVar1 = Prog::SearchDFA(this_00,(StringPiece *)local_1b0,&local_1e0,kUnanchored,kFirstMatch,
                            (StringPiece *)0x0,&failed,(vector<int,_std::allocator<int>_> *)0x0);
    if (failed != false) {
      LogMessage::LogMessage
                ((LogMessage *)local_1b0,
                 "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/dfa_test.cc"
                 ,0xdd,3);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_1b0 + 8),"Check failed: !failed",0x15);
      LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_1b0);
    }
    if (bVar1) {
      LogMessage::LogMessage
                ((LogMessage *)local_1b0,
                 "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/dfa_test.cc"
                 ,0xde,3);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_1b0 + 8),"Check failed: !matched",0x16);
      LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_1b0);
    }
    iVar2 = iVar2 + -1;
  } while (iVar2 != 0);
  if (this_00 != (Prog *)0x0) {
    Prog::~Prog(this_00);
    operator_delete(this_00);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)match._M_dataplus._M_p != &match.field_2) {
    operator_delete(match._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)no_match._M_dataplus._M_p != &no_match.field_2) {
    operator_delete(no_match._M_dataplus._M_p);
  }
  return;
}

Assistant:

TEST(SingleThreaded, SearchDFA) {
  // Choice of n is mostly arbitrary, except that:
  //   * making n too big makes the test run for too long.
  //   * making n too small makes the DFA refuse to run,
  //     because it has so little memory compared to the program size.
  // Empirically, n = 18 is a good compromise between the two.
  const int n = 18;

  Regexp* re = Regexp::Parse(StringPrintf("0[01]{%d}$", n),
                             Regexp::LikePerl, NULL);
  CHECK(re);

  // The De Bruijn string for n ends with a 1 followed by n 0s in a row,
  // which is not a match for 0[01]{n}$.  Adding one more 0 is a match.
  string no_match = DeBruijnString(n);
  string match = no_match + "0";

  // The De Bruijn string is the worst case input for this regexp.
  // By default, the DFA will notice that it is flushing its cache
  // too frequently and will bail out early, so that RE2 can use the
  // NFA implementation instead.  (The DFA loses its speed advantage
  // if it can't get a good cache hit rate.)
  // Tell the DFA to trudge along instead.
  FLAGS_re2_dfa_bail_when_slow = false;

  int64 usage;
  int64 peak_usage;
  {
    testing::MallocCounter m(testing::MallocCounter::THIS_THREAD_ONLY);
    Prog* prog = re->CompileToProg(1<<n);
    CHECK(prog);
    for (int i = 0; i < 10; i++) {
      bool matched, failed = false;
      matched = prog->SearchDFA(match, NULL,
                                Prog::kUnanchored, Prog::kFirstMatch,
                                NULL, &failed, NULL);
      CHECK(!failed);
      CHECK(matched);
      matched = prog->SearchDFA(no_match, NULL,
                                Prog::kUnanchored, Prog::kFirstMatch,
                                NULL, &failed, NULL);
      CHECK(!failed);
      CHECK(!matched);
    }
    usage = m.HeapGrowth();
    peak_usage = m.PeakHeapGrowth();
    delete prog;
  }
  if (!UsingMallocCounter)
    return;
  //LOG(INFO) << "usage " << usage << ", "
  //          << "peak usage " << peak_usage;
  CHECK_LT(usage, 1<<n);
  CHECK_LT(peak_usage, 1<<n);
  re->Decref();
}